

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O1

ScriptPtr __thiscall
Jinx::Impl::Runtime::CreateScript(Runtime *this,BufferPtr *bytecode,Any *userContext)

{
  any *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ScriptPtr SVar2;
  undefined1 local_49;
  shared_ptr<Jinx::Buffer> local_48;
  shared_ptr<Jinx::Impl::Runtime> local_38;
  IRuntime local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<Jinx::Impl::Runtime,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Jinx::Impl::Runtime,void>
            ((__shared_ptr<Jinx::Impl::Runtime,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (__weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2> *)
             &(bytecode->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)userContext->_M_manager;
  local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(userContext->_M_storage)._M_ptr;
  if (local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_28._vptr_IRuntime = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Jinx::Impl::Script,Jinx::Allocator<Jinx::Impl::Script>,std::shared_ptr<Jinx::Impl::Runtime>,std::shared_ptr<Jinx::Buffer>,std::any&>
            (&local_20,(Script **)&local_28,(Allocator<Jinx::Impl::Script> *)&local_49,&local_38,
             &local_48,in_RCX);
  std::__shared_ptr<Jinx::Impl::Script,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<Jinx::Impl::Script,Jinx::Impl::Script>
            ((__shared_ptr<Jinx::Impl::Script,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (Script *)local_28._vptr_IRuntime);
  _Var1._M_pi = local_20._M_pi;
  (this->super_IRuntime)._vptr_IRuntime = local_28._vptr_IRuntime;
  (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
  super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
  super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_28._vptr_IRuntime = (_func_int **)0x0;
  _Var1._M_pi = extraout_RDX;
  if (local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_38.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_38.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  SVar2.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  SVar2.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ScriptPtr)SVar2.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline_t ScriptPtr Runtime::CreateScript(BufferPtr bytecode, Any userContext)
	{
		return std::allocate_shared<Script>(Allocator<Script>(), shared_from_this(), std::static_pointer_cast<Buffer>(bytecode), userContext);
	}